

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.h
# Opt level: O0

uint64_t __thiscall
bloaty::RangeMap::RangeEndUnknownLimit(RangeMap *this,const_iterator iter,uint64_t unknown)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *in_RDX;
  uint64_t ret;
  const_iterator next;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
  in_stack_ffffffffffffffa8;
  unsigned_long uVar3;
  const_iterator in_stack_ffffffffffffffb0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *p_Var4;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *local_8;
  
  ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
           operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                       *)in_stack_ffffffffffffffb0._M_node);
  if ((ppVar2->second).size == 0xffffffffffffffff) {
    std::next<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
              (in_stack_ffffffffffffffa8,0x1876f7);
    bVar1 = IterIsEnd((RangeMap *)in_stack_ffffffffffffffa8._M_node,in_stack_ffffffffffffffb0);
    local_8 = in_RDX;
    if ((!bVar1) &&
       (ppVar2 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
                 operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                             *)in_stack_ffffffffffffffb0._M_node),
       (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
       ppVar2->first <= in_RDX)) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                           *)in_stack_ffffffffffffffb0._M_node);
      local_8 = (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *
                )ppVar2->first;
    }
  }
  else {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                           *)in_stack_ffffffffffffffb0._M_node);
    uVar3 = ppVar2->first;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                           *)in_stack_ffffffffffffffb0._M_node);
    local_8 = (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_> *)
              (uVar3 + (ppVar2->second).size);
    p_Var4 = local_8;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
             ::operator->(local_8);
    if (p_Var4 <= (_Rb_tree_const_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                   *)ppVar2->first) {
      __assert_fail("ret > iter->first",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.h"
                    ,0xda,
                    "uint64_t bloaty::RangeMap::RangeEndUnknownLimit(Map::const_iterator, uint64_t) const"
                   );
    }
  }
  return (uint64_t)local_8;
}

Assistant:

uint64_t RangeEndUnknownLimit(Map::const_iterator iter,
                                uint64_t unknown) const {
    if (iter->second.size == kUnknownSize) {
      Map::const_iterator next = std::next(iter);
      if (IterIsEnd(next) || next->first > unknown) {
        return unknown;
      } else {
        return next->first;
      }
    } else {
      uint64_t ret = iter->first + iter->second.size;
      assert(ret > iter->first);
      return ret;
    }
  }